

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdio_greater_than_3(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_stdio_container_t stdio [4];
  uv_pipe_t pipe;
  
  init_process_options("spawn_helper5",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&pipe,0);
  stdio[0].flags = UV_IGNORE;
  stdio[1].flags = UV_IGNORE;
  stdio[2].flags = UV_IGNORE;
  stdio[3].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 4;
  options.stdio = stdio;
  stdio[3].data.stream = (uv_stream_t *)&pipe;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 == 0) {
    iVar1 = uv_read_start((uv_stream_t *)&pipe,on_alloc,on_read);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        if (exit_cb_called == 1) {
          if (close_cb_called == 2) {
            printf("output from stdio[3] is: %s",output);
            iVar1 = bcmp("fourth stdio!\n",output,0xf);
            if (iVar1 == 0) {
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x28f;
            }
            else {
              pcVar4 = "strcmp(\"fourth stdio!\\n\", output) == 0";
              uVar3 = 0x28d;
            }
          }
          else {
            pcVar4 = "close_cb_called == 2";
            uVar3 = 0x28b;
          }
        }
        else {
          pcVar4 = "exit_cb_called == 1";
          uVar3 = 0x28a;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x288;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x285;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x282;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdio_greater_than_3) {
  int r;
  uv_pipe_t pipe;
  uv_stdio_container_t stdio[4];

  init_process_options("spawn_helper5", exit_cb);

  uv_pipe_init(uv_default_loop(), &pipe, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_IGNORE;
  options.stdio[2].flags = UV_IGNORE;
  options.stdio[3].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[3].data.stream = (uv_stream_t*)&pipe;
  options.stdio_count = 4;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &pipe, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* Once for process once for the pipe. */
  printf("output from stdio[3] is: %s", output);
  ASSERT(strcmp("fourth stdio!\n", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}